

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::TestCheckRewriteString(char *regexp,char *rewrite,bool expect_ok)

{
  bool bVar1;
  ostream *poVar2;
  string error;
  RE2 exp;
  string local_298;
  RE2 local_278;
  LogMessageFatal local_198;
  
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  RE2::RE2(&local_278,regexp);
  StringPiece::StringPiece((StringPiece *)&local_198,rewrite);
  bVar1 = RE2::CheckRewriteString(&local_278,(StringPiece *)&local_198,&local_298);
  if (bVar1 != expect_ok) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xc2);
    poVar2 = std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                             "Check failed: (expect_ok) == (actual_ok)");
    poVar2 = std::operator<<(poVar2," for ");
    poVar2 = std::operator<<(poVar2,rewrite);
    poVar2 = std::operator<<(poVar2," error: ");
    std::operator<<(poVar2,(string *)&local_298);
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  RE2::~RE2(&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  return;
}

Assistant:

static void TestCheckRewriteString(const char* regexp, const char* rewrite,
                              bool expect_ok) {
  string error;
  RE2 exp(regexp);
  bool actual_ok = exp.CheckRewriteString(rewrite, &error);
  EXPECT_EQ(expect_ok, actual_ok) << " for " << rewrite << " error: " << error;
}